

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O2

void squall::detail::call_setup<int,int,int,int>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,int args,int args_1,int args_2,
               int args_3)

{
  SQRESULT SVar1;
  squirrel_error *psVar2;
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  obj._4_4_ = 0;
  obj._type = table->_type;
  obj._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj);
  sq_pushstring(vm,(name->_M_dataplus)._M_p,name->_M_string_length);
  SVar1 = sq_get(vm,-2);
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"can\'t find such function: ",name);
    squirrel_error::squirrel_error(psVar2,&local_50);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sq_remove(vm,-2);
  obj_00._4_4_ = 0;
  obj_00._type = table->_type;
  obj_00._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj_00);
  call_setup_arg<int,int,int,int>(vm,args,args_1,args_2,args_3);
  SVar1 = sq_call(vm,5,1,1);
  if (-1 < SVar1) {
    return;
  }
  psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"function call failed: ",name);
  squirrel_error::squirrel_error(psVar2,&local_50);
  __cxa_throw(psVar2,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}